

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void flatbuffers::EnsureDirExists(string *filepath)

{
  string parent;
  string local_30;
  
  StripFileName(&local_30,filepath);
  if (local_30._M_string_length != 0) {
    EnsureDirExists(&local_30);
  }
  mkdir((filepath->_M_dataplus)._M_p,0x1e8);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void EnsureDirExists(const std::string &filepath) {
  auto parent = StripFileName(filepath);
  if (parent.length()) EnsureDirExists(parent);
    // clang-format off

  #ifdef _WIN32
    (void)_mkdir(filepath.c_str());
  #else
    mkdir(filepath.c_str(), S_IRWXU|S_IRGRP|S_IXGRP);
  #endif
  // clang-format on
}